

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

Am_Wrapper * find_prev_child_proc(Am_Object *self)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  ushort uVar7;
  Am_Object item;
  Am_Value_List nodes;
  Am_Object local_40 [8];
  Am_Value_List local_38 [16];
  
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PARENT);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if (iVar3 == iVar4) {
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
    return pAVar6;
  }
  Am_Object::Get_Owner(local_40,(Am_Slot_Flags)self);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_40,0x82);
  Am_Value_List::Am_Value_List(local_38,pAVar5);
  Am_Object::~Am_Object(local_40);
  cVar2 = Am_Value_List::Valid();
  if (cVar2 == '\0') {
LAB_00103dc7:
    self = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
  }
  else {
    Am_Value_List::Move_Nth((int)local_38);
    Am_Value_List::Next();
    do {
      cVar2 = Am_Value_List::Last();
      if (cVar2 != '\0') goto LAB_00103dc7;
      pAVar5 = (Am_Value *)Am_Value_List::Get();
      Am_Object::Am_Object(local_40,pAVar5);
      uVar7 = (ushort)local_40;
      pAVar5 = (Am_Value *)Am_Object::Get(uVar7,(ulong)PARENT);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar3 == iVar4) {
        pAVar5 = (Am_Value *)Am_Object::Get(uVar7,0x85);
        iVar3 = Am_Value::operator_cast_to_int(pAVar5);
        if (iVar3 == iVar4) goto LAB_00103d9e;
        self = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_(local_40);
        bVar1 = false;
      }
      else {
LAB_00103d9e:
        bVar1 = true;
        Am_Value_List::Next();
      }
      Am_Object::~Am_Object(local_40);
    } while (bVar1);
  }
  Am_Value_List::~Am_Value_List(local_38);
  return (Am_Wrapper *)self;
}

Assistant:

Am_Define_Object_Formula(find_prev_child)
{
  int rank = self.Get(Am_RANK);
  int parent_rank = self.Get(PARENT);
  if (rank == parent_rank)
    return Am_No_Object;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid()) {
    nodes.Move_Nth(rank);
    nodes.Next();
    while (!nodes.Last()) {
      Am_Object item = nodes.Get();
      if ((int)item.Get(PARENT) == parent_rank &&
          (int)item.Get(Am_RANK) != parent_rank)
        return item;
      nodes.Next();
    }
  }
  return Am_No_Object;
}